

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

void recff_ffi_fill(jit_State *J,RecordFFData *rd)

{
  ushort uVar1;
  TRef *pTVar2;
  CTState *cts;
  CType *pCVar3;
  TRef TVar4;
  TRef TVar5;
  TRef TVar6;
  CType *pCVar7;
  CTSize step;
  cTValue *pcVar8;
  CTSize sz;
  CTSize local_34;
  
  pTVar2 = J->base;
  TVar4 = *pTVar2;
  TVar5 = pTVar2[1];
  if (TVar5 != 0 && TVar4 != 0) {
    cts = *(CTState **)&J[-1].penalty[0x3c].val;
    TVar6 = pTVar2[2];
    if ((rd->argv->field_4).it >> 0xf == 0x1fff5) {
      uVar1 = *(ushort *)(((ulong)rd->argv->field_4 & 0x7fffffffffff) + 10);
      pCVar3 = cts->tab;
      pCVar7 = pCVar3 + uVar1;
      if ((pCVar3[uVar1].info & 0xf0000000) == 0x20000000) {
        pCVar7 = pCVar3 + (ushort)pCVar7->info;
      }
      lj_ctype_info(cts,(int)((ulong)((long)pCVar7 - (long)pCVar3) >> 3) * -0x55555555,&local_34);
    }
    TVar4 = crec_ct_tv(J,cts->tab + 0x11,0,TVar4,rd->argv);
    pcVar8 = rd->argv + 1;
    TVar5 = crec_ct_tv(J,cts->tab + 9,0,TVar5,pcVar8);
    step = (CTSize)pcVar8;
    if (TVar6 == 0) {
      TVar6 = lj_ir_kint(J,0);
    }
    else {
      pcVar8 = rd->argv + 2;
      TVar6 = crec_ct_tv(J,cts->tab + 9,0,TVar6,pcVar8);
      step = (CTSize)pcVar8;
    }
    rd->nres = 0;
    crec_fill(J,TVar4,TVar5,TVar6,step);
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_fill(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef trdst = J->base[0], trlen = J->base[1], trfill = J->base[2];
  if (trdst && trlen) {
    CTSize step = 1;
    if (tviscdata(&rd->argv[0])) {  /* Get alignment of original destination. */
      CTSize sz;
      CType *ct = ctype_raw(cts, cdataV(&rd->argv[0])->ctypeid);
      if (ctype_isptr(ct->info))
	ct = ctype_rawchild(cts, ct);
      step = (1u<<ctype_align(lj_ctype_info(cts, ctype_typeid(cts, ct), &sz)));
    }
    trdst = crec_ct_tv(J, ctype_get(cts, CTID_P_VOID), 0, trdst, &rd->argv[0]);
    trlen = crec_toint(J, cts, trlen, &rd->argv[1]);
    if (trfill)
      trfill = crec_toint(J, cts, trfill, &rd->argv[2]);
    else
      trfill = lj_ir_kint(J, 0);
    rd->nres = 0;
    crec_fill(J, trdst, trlen, trfill, step);
  }  /* else: interpreter will throw. */
}